

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O0

void __thiscall TextureImage::Texture::Texture(Texture *this)

{
  Texture *this_local;
  
  this->_vptr_Texture = (_func_int **)&PTR__Texture_00379d60;
  this->available = false;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->filename);
  this->width = 0;
  this->height = 0;
  this->tex = 0;
  return;
}

Assistant:

Texture()
                : available(false), name(), filename(), width(0), height(0), tex(0) {}